

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int k;
  float sum;
  float *ptrB;
  int j_2;
  float *ptrA;
  int i_2;
  float *outptr;
  Mat *top_blob;
  Mat *C;
  int broadcast_type_C;
  float *ptrC;
  bool has_C;
  int N;
  int K;
  int M;
  int j_1;
  float *ptr_1;
  int i_1;
  Mat B;
  int j;
  float *ptr;
  int i;
  Mat A;
  size_t elemsize;
  Mat *B0;
  Mat *A0;
  Allocator *in_stack_fffffffffffffc68;
  value_type *pvVar5;
  size_t in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  Mat *in_stack_fffffffffffffc80;
  bool local_359;
  int local_2f0;
  float local_2ec;
  int local_2dc;
  int local_2cc;
  float *local_2c8;
  int local_2a4;
  float *local_2a0;
  int local_284;
  int local_274;
  value_type local_270;
  int local_224;
  void *local_220;
  int local_218;
  value_type local_208;
  size_t local_1c0;
  const_reference local_1b8;
  const_reference local_1b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_198;
  int local_184;
  value_type *local_180;
  value_type *local_178;
  int local_170;
  undefined4 local_16c;
  const_reference local_168;
  const_reference local_160;
  const_reference local_158;
  int local_150;
  undefined4 local_14c;
  const_reference local_148;
  const_reference local_140;
  const_reference local_138;
  int local_12c;
  value_type *local_128;
  int local_11c;
  value_type *local_118;
  int local_10c;
  value_type *local_108;
  int local_fc;
  value_type *local_f8;
  int local_ec;
  const_reference local_e8;
  int local_dc;
  const_reference local_d8;
  const_reference local_d0;
  reference local_c8;
  reference local_c0;
  value_type *local_b8;
  value_type *local_a8;
  int local_88;
  undefined4 local_84;
  value_type *local_80;
  int local_68;
  undefined4 local_64;
  value_type *local_60;
  const_reference local_50;
  const_reference local_40;
  void *local_28;
  void *local_18;
  reference local_8;
  
  local_1a0 = in_RDX;
  local_198 = in_RSI;
  local_1b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_198,1);
  local_1c0 = local_1b0->elemsize;
  local_180 = &local_208;
  local_208.data = (void *)0x0;
  local_208.refcount = (int *)0x0;
  local_208.elemsize = 0;
  local_208.elempack = 0;
  local_208.allocator = (Allocator *)0x0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  local_208.cstep = 0;
  if (*(int *)(in_RDI + 0xd8) == 0) {
    local_140 = &local_208;
    if (local_140 != local_1b0) {
      if (local_1b0->refcount != (int *)0x0) {
        piVar1 = local_1b0->refcount;
        local_14c = 1;
        LOCK();
        local_150 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_208.data = local_1b0->data;
      local_208.refcount = local_1b0->refcount;
      local_208.elemsize = local_1b0->elemsize;
      local_208.elempack = local_1b0->elempack;
      local_208.allocator = local_1b0->allocator;
      local_208.dims = local_1b0->dims;
      local_208.w = local_1b0->w;
      local_208.h = local_1b0->h;
      local_208.d = local_1b0->d;
      local_208.c = local_1b0->c;
      local_208.cstep = local_1b0->cstep;
      local_50 = local_140;
    }
    local_148 = local_1b0;
    local_138 = local_140;
  }
  else {
    Mat::create(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                (int)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    for (local_218 = 0; local_218 < local_208.h; local_218 = local_218 + 1) {
      local_fc = local_218;
      local_f8 = &local_208;
      local_220 = (void *)((long)local_208.data +
                          (long)local_208.w * (long)local_218 * local_208.elemsize);
      for (local_224 = 0; local_224 < local_208.w; local_224 = local_224 + 1) {
        local_d8 = local_1b0;
        local_dc = local_224;
        *(undefined4 *)((long)local_220 + (long)local_224 * 4) =
             *(undefined4 *)
              ((long)local_1b0->data +
              (long)local_218 * 4 + (long)local_1b0->w * (long)local_224 * local_1b0->elemsize);
      }
    }
  }
  local_178 = &local_270;
  local_270.data = (void *)0x0;
  local_270.refcount = (int *)0x0;
  local_270.elemsize = 0;
  local_270.elempack = 0;
  local_270.allocator = (Allocator *)0x0;
  local_270.dims = 0;
  local_270.w = 0;
  local_270.h = 0;
  local_270.d = 0;
  local_270.c = 0;
  local_270.cstep = 0;
  if (*(int *)(in_RDI + 0xdc) == 0) {
    Mat::create(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                (int)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    for (local_274 = 0; local_274 < local_270.h; local_274 = local_274 + 1) {
      local_10c = local_274;
      local_108 = &local_270;
      for (local_284 = 0; local_284 < local_270.w; local_284 = local_284 + 1) {
        local_e8 = local_1b8;
        local_ec = local_284;
        *(undefined4 *)
         ((long)local_270.data +
         (long)local_284 * 4 + (long)local_270.w * (long)local_274 * local_270.elemsize) =
             *(undefined4 *)
              ((long)local_1b8->data +
              (long)local_274 * 4 + (long)local_1b8->w * (long)local_284 * local_1b8->elemsize);
      }
    }
  }
  else {
    local_160 = &local_270;
    if (local_160 != local_1b8) {
      if (local_1b8->refcount != (int *)0x0) {
        piVar1 = local_1b8->refcount;
        local_16c = 1;
        LOCK();
        local_170 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_270.data = local_1b8->data;
      local_270.refcount = local_1b8->refcount;
      local_270.elemsize = local_1b8->elemsize;
      local_270.elempack = local_1b8->elempack;
      local_270.allocator = local_1b8->allocator;
      local_270.dims = local_1b8->dims;
      local_270.w = local_1b8->w;
      local_270.h = local_1b8->h;
      local_270.d = local_1b8->d;
      local_270.c = local_1b8->c;
      local_270.cstep = local_1b8->cstep;
      local_40 = local_160;
    }
    local_168 = local_1b8;
    local_158 = local_160;
  }
  iVar2 = local_208.w;
  sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_198);
  local_2a0 = (float *)0x0;
  local_2a4 = 0;
  if (sVar3 == 3) {
    local_d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_198,2);
    local_2a0 = (float *)local_d0->data;
    local_2a4 = 0;
    if ((local_d0->dims == 1) && (local_d0->w == local_208.h)) {
      local_2a4 = 1;
    }
    if ((local_d0->dims == 1) && (local_d0->w == local_270.h)) {
      local_2a4 = 4;
    }
    if (((local_d0->dims == 2) && (local_d0->w == 1)) && (local_d0->h == local_208.h)) {
      local_2a4 = 2;
    }
    if (((local_d0->dims == 2) && (local_d0->w == local_270.h)) && (local_d0->h == local_208.h)) {
      local_2a4 = 3;
    }
    if (((local_d0->dims == 2) && (local_d0->w == local_270.h)) && (local_d0->h == 1)) {
      local_2a4 = 4;
    }
  }
  pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a0,0);
  Mat::create(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
              (int)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  local_359 = true;
  if (pvVar4->data != (void *)0x0) {
    local_359 = pvVar4->cstep * (long)pvVar4->c == 0;
    local_8 = pvVar4;
  }
  if (local_359) {
    local_184 = -100;
  }
  else {
    local_2c8 = (float *)pvVar4->data;
    for (local_2cc = 0; local_2cc < local_208.h; local_2cc = local_2cc + 1) {
      local_118 = &local_208;
      local_11c = local_2cc;
      for (local_2dc = 0; local_2dc < local_270.h; local_2dc = local_2dc + 1) {
        local_12c = local_2dc;
        local_128 = &local_270;
        local_2ec = 0.0;
        if (sVar3 == 3) {
          if (local_2a4 == 0) {
            local_2ec = *local_2a0;
          }
          if (local_2a4 == 1) {
            local_2ec = local_2a0[local_2cc];
          }
          if (local_2a4 == 2) {
            local_2ec = local_2a0[local_2cc];
          }
          if (local_2a4 == 3) {
            local_2ec = local_2a0[local_2cc * local_270.h + local_2dc];
          }
          if (local_2a4 == 4) {
            local_2ec = local_2a0[local_2dc];
          }
          local_2ec = *(float *)(in_RDI + 0xd4) * local_2ec;
        }
        for (local_2f0 = 0; local_2f0 < iVar2; local_2f0 = local_2f0 + 1) {
          local_2ec = *(float *)((long)local_208.data +
                                (long)local_2f0 * 4 +
                                (long)local_208.w * (long)local_2cc * local_208.elemsize) *
                      *(float *)((long)local_270.data +
                                (long)local_2f0 * 4 +
                                (long)local_270.w * (long)local_2dc * local_270.elemsize) +
                      local_2ec;
        }
        *local_2c8 = local_2ec * *(float *)(in_RDI + 0xd0);
        local_2c8 = local_2c8 + 1;
      }
    }
    local_184 = 0;
    local_c0 = pvVar4;
  }
  pvVar5 = &local_270;
  local_c8 = pvVar4;
  local_b8 = pvVar5;
  local_60 = pvVar5;
  if (local_270.refcount != (int *)0x0) {
    local_64 = 0xffffffff;
    LOCK();
    local_68 = *local_270.refcount;
    *local_270.refcount = *local_270.refcount + -1;
    UNLOCK();
    if (local_68 == 1) {
      if (local_270.allocator == (Allocator *)0x0) {
        local_28 = local_270.data;
        if (local_270.data != (void *)0x0) {
          free(local_270.data);
        }
      }
      else {
        (*(local_270.allocator)->_vptr_Allocator[3])(local_270.allocator,local_270.data);
      }
    }
  }
  pvVar5->data = (void *)0x0;
  pvVar5->elemsize = 0;
  pvVar5->elempack = 0;
  pvVar5->dims = 0;
  pvVar5->w = 0;
  pvVar5->h = 0;
  pvVar5->d = 0;
  pvVar5->c = 0;
  pvVar5->cstep = 0;
  pvVar5->refcount = (int *)0x0;
  pvVar5 = &local_208;
  if (local_208.refcount != (int *)0x0) {
    local_84 = 0xffffffff;
    LOCK();
    local_88 = *local_208.refcount;
    *local_208.refcount = *local_208.refcount + -1;
    UNLOCK();
    if (local_88 == 1) {
      local_a8 = pvVar5;
      local_80 = pvVar5;
      if (local_208.allocator == (Allocator *)0x0) {
        local_18 = local_208.data;
        if (local_208.data != (void *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])(local_208.allocator,local_208.data);
      }
    }
  }
  pvVar5->data = (void *)0x0;
  pvVar5->elemsize = 0;
  pvVar5->elempack = 0;
  pvVar5->dims = 0;
  pvVar5->w = 0;
  pvVar5->h = 0;
  pvVar5->d = 0;
  pvVar5->c = 0;
  pvVar5->cstep = 0;
  pvVar5->refcount = (int *)0x0;
  return local_184;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = bottom_blobs[0];
    const Mat& B0 = bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create(A0.h, A0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0.row(j)[i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create(B0.h, B0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0.row(j)[i];
            }
        }
    }
    else
    {
        B = B0;
    }

    int M = A.h;
    int K = A.w; // assert A.w == B.w
    int N = B.h;

    bool has_C = bottom_blobs.size() == 3;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (has_C)
    {
        const Mat& C = bottom_blobs[2];

        ptrC = C;

        if (C.dims == 1 && C.w == 1)
        {
            // scalar
            broadcast_type_C = 0;
        }
        if (C.dims == 1 && C.w == M)
        {
            // M
            // auto broadcast from h to w is the ncnn-style convention
            broadcast_type_C = 1;
        }
        if (C.dims == 1 && C.w == N)
        {
            // N
            broadcast_type_C = 4;
        }
        if (C.dims == 2 && C.w == 1 && C.h == M)
        {
            // Mx1
            broadcast_type_C = 2;
        }
        if (C.dims == 2 && C.w == N && C.h == M)
        {
            // MxN
            broadcast_type_C = 3;
        }
        if (C.dims == 2 && C.w == N && C.h == 1)
        {
            // 1xN
            broadcast_type_C = 4;
        }
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(N, M, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* outptr = top_blob;
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = A.row(i);

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = B.row(j);

            float sum = 0.f;
            if (has_C)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum * alpha;
        }
    }

    return 0;
}